

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ip_tables_t *ipts;
  packet_t *pkt;
  packet_t *ppVar3;
  bool bVar4;
  char *pcVar5;
  
  if (argc == 2) {
    pcVar5 = argv[1];
  }
  else {
    pcVar5 = "../test.txt";
  }
  ipts = parse_tables(pcVar5);
  print_tables(ipts);
  pkt = new_tcp_pkt("192.168.1.100","192.168.1.101",0x3039,0x50,'\x02');
  ppVar3 = new_tcp_pkt("192.168.1.101","192.168.1.100",0x3039,0x50,'\x02');
  bVar1 = true;
  do {
    bVar4 = bVar1;
    pkt_set_iface(pkt,"ens33",(char *)0x0);
    if (pkt != (packet_t *)0x0) {
      pkt->state = '\x02';
    }
    print_pkt(pkt);
    iVar2 = match_tables(ipts,pkt,(ip_opt_t *)0x0);
    pcVar5 = "ACCEPT";
    if (iVar2 == 0) {
      pcVar5 = "DROP";
    }
    printf("match result\t: %s\n",pcVar5);
    free_pkt(pkt);
    pkt = ppVar3;
    bVar1 = false;
  } while (bVar4);
  free_tables(ipts);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
	char *p = "../test.txt";

	if (argc == 2) {
		p = argv[1];
	}

	ip_tables_t *ipts = parse_tables(p);
	print_tables(ipts);

	packet_t *pkts[2];

	pkts[0] = new_tcp_pkt("192.168.1.100", "192.168.1.101", 12345, 80, TCP_SYN);
	pkts[1] = new_tcp_pkt("192.168.1.101", "192.168.1.100", 12345, 80, TCP_SYN);

	//pkts[0] = new_udp_pkt("192.168.1.100", "192.168.1.101", 12345, 80);
	//pkts[1] = new_udp_pkt("192.168.1.101", "192.168.1.100", 12345, 80);

	for (int i = 0; i < 2; i++) {

		pkt_set_iface(pkts[i], "ens33", NULL);
		pkt_set_state(pkts[i], STATE_NEW);
		print_pkt(pkts[i]);
		printf("match result\t: %s\n", match_tables(ipts, pkts[i], NULL) ? "ACCEPT" : "DROP");
		free_pkt(pkts[i]);
	}


	free_tables(ipts);
	return 0;
}